

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

bool anon_unknown.dwarf_a4b191::HasNonLayoutQualifiers(TType *type,TQualifier *qualifier)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = true;
  if ((qualifier->field_0xb & 0x10) == 0) {
    if ((~*(uint *)&qualifier->field_0x1c & 0xfff) != 0) {
      iVar2 = (*type->_vptr_TType[7])();
      return iVar2 == 0x10;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HasNonLayoutQualifiers(const glslang::TType& type, const glslang::TQualifier& qualifier)
{
    // This should list qualifiers that simultaneous satisfy:
    // - struct members might inherit from a struct declaration
    //     (note that non-block structs don't explicitly inherit,
    //      only implicitly, meaning no decoration involved)
    // - affect decorations on the struct members
    //     (note smooth does not, and expecting something like volatile
    //      to effect the whole object)
    // - are not part of the offset/st430/etc or row/column-major layout
    return qualifier.invariant || (qualifier.hasLocation() && type.getBasicType() == glslang::EbtBlock);
}